

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hpack.cpp
# Opt level: O2

Header * __thiscall
Hpack::decodeHTTP2Header
          (Header *__return_storage_ptr__,Hpack *this,char *receivedPayload,uint length)

{
  byte bVar1;
  byte bVar2;
  ostream *poVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  char *pcVar8;
  ulong uVar9;
  uint uVar10;
  size_t j;
  string valueString;
  undefined1 local_178 [40];
  string local_150 [32];
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  Header::Header(__return_storage_ptr__);
  poVar3 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<(poVar3,"Header binary: ");
  for (uVar9 = 0; length != uVar9; uVar9 = uVar9 + 1) {
    *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
    std::ostream::operator<<((ostream *)&std::cout,(uint)(byte)receivedPayload[uVar9]);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  uVar6 = 0;
LAB_00132d68:
  do {
    while( true ) {
      if (length <= uVar6) {
        return __return_storage_ptr__;
      }
      bVar2 = receivedPayload[uVar6];
      if ((char)bVar2 < '\0') {
        StaticTableLine::StaticTableLine
                  ((StaticTableLine *)local_178,StaticTable::static_table + ((bVar2 & 0x7f) - 1));
        std::__cxx11::string::string((string *)&local_d0,(string *)(local_178 + 8));
        std::__cxx11::string::string((string *)&local_50,local_150);
        Header::setHeaderline(__return_storage_ptr__,&local_d0,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_d0);
        poVar3 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        poVar3 = std::operator<<(poVar3,"Indexed Header Field Representation, index: ");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        poVar3 = std::operator<<(poVar3,", at: ");
        uVar6 = uVar6 + 1;
        *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
             *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
        std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        StaticTableLine::~StaticTableLine((StaticTableLine *)local_178);
        goto LAB_00132d68;
      }
      if (0x3f < bVar2) break;
      if ((bVar2 & 0x30) == 0x10) {
        bVar1 = receivedPayload[(ulong)uVar6 + 1];
        poVar3 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        poVar3 = std::operator<<(poVar3,"Literal Header Field Never Indexed, index: ");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        poVar3 = std::operator<<(poVar3,", at: ");
        uVar4 = uVar6 + 2;
        *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
             *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        poVar3 = std::operator<<(poVar3,", length: ");
        uVar10 = bVar1 & 0x7f;
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        poVar3 = std::operator<<(poVar3,", huffman: ");
        poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
        pcVar8 = ", binary: ";
        std::operator<<(poVar3,", binary: ");
        uVar6 = uVar6 + uVar10 + 2;
        for (uVar9 = 0; uVar10 != uVar9; uVar9 = uVar9 + 1) {
          *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
               *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xffffffb5 |
               8;
          uVar7 = (byte)(receivedPayload + uVar4)[uVar9] & 0xf;
          pcVar8 = (char *)(ulong)uVar7;
          std::ostream::operator<<((ostream *)&std::cout,uVar7);
        }
        handeBinary_abi_cxx11_
                  ((string *)local_178,(Hpack *)pcVar8,receivedPayload + uVar4,uVar10,
                   (bool)(bVar1 >> 7));
        std::__cxx11::string::string
                  ((string *)&local_130,
                   (string *)&StaticTable::static_table[(bVar2 & 0xf) - 1].header_name);
        std::__cxx11::string::string((string *)&local_b0,(string *)local_178);
        Header::setHeaderline(__return_storage_ptr__,&local_130,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_130);
        poVar3 = std::operator<<((ostream *)&std::cout,", name: ");
        std::operator<<(poVar3,(string *)local_178);
        goto LAB_0013335b;
      }
      if ((bVar2 & 0x30) == 0) {
        bVar1 = receivedPayload[(ulong)uVar6 + 1];
        poVar3 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        poVar3 = std::operator<<(poVar3,"Literal Header Field without Indexing: ");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        poVar3 = std::operator<<(poVar3,", at: ");
        uVar4 = uVar6 + 2;
        *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
             *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        poVar3 = std::operator<<(poVar3,", length: ");
        uVar10 = bVar1 & 0x7f;
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        poVar3 = std::operator<<(poVar3,", huffman: ");
        poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
        pcVar8 = ", binary: ";
        std::operator<<(poVar3,", binary: ");
        uVar6 = uVar6 + uVar10 + 2;
        for (uVar9 = 0; uVar10 != uVar9; uVar9 = uVar9 + 1) {
          *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
               *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xffffffb5 |
               8;
          uVar7 = (byte)(receivedPayload + uVar4)[uVar9] & 0xf;
          pcVar8 = (char *)(ulong)uVar7;
          std::ostream::operator<<((ostream *)&std::cout,uVar7);
        }
        handeBinary_abi_cxx11_
                  ((string *)local_178,(Hpack *)pcVar8,receivedPayload + uVar4,uVar10,
                   (bool)(bVar1 >> 7));
        std::__cxx11::string::string
                  ((string *)&local_110,
                   (string *)&StaticTable::static_table[(bVar2 & 0xf) - 1].header_name);
        std::__cxx11::string::string((string *)&local_90,(string *)local_178);
        Header::setHeaderline(__return_storage_ptr__,&local_110,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_110);
        poVar3 = std::operator<<((ostream *)&std::cout,", name: ");
        std::operator<<(poVar3,(string *)local_178);
        goto LAB_0013335b;
      }
      if (0x1f < bVar2) goto code_r0x00132da9;
    }
    bVar1 = receivedPayload[(ulong)uVar6 + 1];
    poVar3 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar3 = std::operator<<(poVar3,"Literal Header Field with Incremental Indexing, index: ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,", at: ");
    uVar4 = uVar6 + 2;
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,", length: ");
    uVar10 = bVar1 & 0x7f;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,", huffman: ");
    poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
    pcVar8 = ", binary: ";
    std::operator<<(poVar3,", binary: ");
    uVar6 = uVar6 + uVar10 + 2;
    for (uVar9 = 0; uVar10 != uVar9; uVar9 = uVar9 + 1) {
      *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
      uVar7 = (byte)(receivedPayload + uVar4)[uVar9] & 0xf;
      pcVar8 = (char *)(ulong)uVar7;
      std::ostream::operator<<((ostream *)&std::cout,uVar7);
    }
    handeBinary_abi_cxx11_
              ((string *)local_178,(Hpack *)pcVar8,receivedPayload + uVar4,uVar10,(bool)(bVar1 >> 7)
              );
    std::__cxx11::string::string
              ((string *)&local_f0,
               (string *)&StaticTable::static_table[(bVar2 & 0x3f) - 1].header_name);
    std::__cxx11::string::string((string *)&local_70,(string *)local_178);
    Header::setHeaderline(__return_storage_ptr__,&local_f0,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_f0);
    poVar3 = std::operator<<((ostream *)&std::cout,", name: ");
    std::operator<<(poVar3,(string *)local_178);
LAB_0013335b:
    std::__cxx11::string::~string((string *)local_178);
  } while( true );
code_r0x00132da9:
  iVar5 = uVar6 - 2;
  bVar2 = 1;
  while (uVar6 = iVar5 + 3, bVar2 != 0) {
    iVar5 = iVar5 + 1;
    bVar2 = (byte)receivedPayload[uVar6] >> 7;
  }
  poVar3 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar3 = std::operator<<(poVar3,"Dynamic Table Size Update, newSize: ");
  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,", at: ");
  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  goto LAB_00132d68;
}

Assistant:

Header Hpack::decodeHTTP2Header(char *receivedPayload, unsigned int length) {
  Header header;
  unsigned int iterator = 0;
  
  //prints out compressed header start
  std::cout << std::endl << "Header binary: ";
  for (unsigned int i = 0; i < length;i++) {std::cout << std::hex << ((int)receivedPayload[i] & 0xFF);}
  std::cout << std::endl;
  //prints out compressed header end
  
  while (iterator < length) {
    
    //Indexed Header Field Representation
    if ((receivedPayload[iterator] & 0x80) >> 7) {
      unsigned int index = receivedPayload[iterator++] & 0x7F;
      
      StaticTableLine line = StaticTable::static_table[index - 1];
      header.setHeaderline(line.header_name, line.header_value);
      
      std::cout << std::endl << "Indexed Header Field Representation, index: " << index << ", at: "  << std::dec << iterator;
    }
    
    //Literal Header Field with Incremental Indexing
    else if ((receivedPayload[iterator] & 0xC0) == 0x40) {
      unsigned int index = receivedPayload[iterator++] & 0x3F, nameLength;
      bool huffman = (receivedPayload[iterator] & 0x80) >> 7;
      nameLength = receivedPayload[iterator++] & 0x7F;
      
      char * stringData = &receivedPayload[iterator];
      iterator += nameLength;
      
      std::cout << std::endl << "Literal Header Field with Incremental Indexing, index: " << index << ", at: " << std::dec << iterator - nameLength << ", length: " << nameLength << ", huffman: " << huffman << ", binary: ";
      for (size_t j = 0; j < nameLength;j++) {
        std::cout << std::hex << ((int)stringData[j] & 0x0F);
      }
      
      std::string valueString(handeBinary(stringData, nameLength, huffman));
      header.setHeaderline(StaticTable::static_table[index - 1].header_name, valueString);
      
      std::cout << ", name: " << valueString;
    }
    
    //Literal Header Field without Indexing
    else if ((receivedPayload[iterator] & 0xF0) == 0x00) {
      unsigned int index = receivedPayload[iterator++] & 0x0F, nameLength;
      bool huffman = (receivedPayload[iterator] & 0x80) >> 7;
      nameLength = receivedPayload[iterator++] & 0x7F;
      
      char * stringData = &receivedPayload[iterator];
      iterator += nameLength;
      
      std::cout << std::endl << "Literal Header Field without Indexing: " << index << ", at: "  << std::dec << iterator  - nameLength << ", length: " << nameLength << ", huffman: " << huffman << ", binary: ";
      for (size_t j = 0; j < nameLength;j++) {
        std::cout << std::hex << ((int)stringData[j] & 0x0F);
      }
      
      std::string valueString(handeBinary(stringData, nameLength, huffman));
      header.setHeaderline(StaticTable::static_table[index - 1].header_name, valueString);
      
      std::cout << ", name: " << valueString;
    }
    
    //Literal Header Field Never Indexed
    else if ((receivedPayload[iterator] & 0xF0) == 0x10) {
      unsigned int index = receivedPayload[iterator++] & 0x0F, nameLength;
      bool huffman = (receivedPayload[iterator] & 0x80) >> 7;
      nameLength = receivedPayload[iterator++] & 0x7F;
      
      char *stringData = &receivedPayload[iterator];
      iterator += nameLength;
      
      std::cout << std::endl << "Literal Header Field Never Indexed, index: " << index << ", at: "  << std::dec << iterator - nameLength << ", length: " << nameLength << ", huffman: " << huffman << ", binary: ";
      
      for (size_t j = 0; j < nameLength;j++) {
        std::cout << std::hex << ((int)stringData[j] & 0x0F);
      }
      if (huffman) {
        //Huffman::decode(stringData, nameLength);
      }
      
      std::string valueString(handeBinary(stringData, nameLength, huffman));
      header.setHeaderline(StaticTable::static_table[index - 1].header_name, valueString);
      
      std::cout << ", name: " << valueString;
    }
    
    //Dynamic Table Size Update
    else if ((receivedPayload[iterator] & 0xE0) == 0x20) {
      unsigned int dynamicTableSizeUpdate = receivedPayload[iterator++] & 0x1F, m = 0;
      
      bool continuation = true;
      while (continuation) {
        dynamicTableSizeUpdate += (receivedPayload[iterator] & 0x7F) << m;
        m += 7;
        continuation = (receivedPayload[iterator++] & 0x80) >> 7;
      }
      
      std::cout << std::endl << "Dynamic Table Size Update, newSize: " << std::dec << dynamicTableSizeUpdate << ", at: "  << std::dec << iterator - 3;
      
      /*
      decode I from the next N bits
      if I < 2^N - 1, return I
      else
          M = 0
          repeat
              B = next octet
              I = I + (B & 127) * 2^M
              M = M + 7
          while B & 128 == 128
          return I
       */
      
    }
  }
  
  return header;
}